

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O3

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::anon_unknown_0::allocateAndBindMemory
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          Context *context,VkBuffer buffer,MemoryRequirement memReqs)

{
  Allocation *pAVar1;
  int iVar2;
  DeviceInterface *vk;
  VkDevice pVVar3;
  Allocator *pAVar4;
  undefined4 extraout_var;
  VkMemoryRequirements bufReqs;
  VkMemoryRequirements VStack_48;
  
  vk = Context::getDeviceInterface(context);
  pVVar3 = Context::getDevice(context);
  ::vk::getBufferMemoryRequirements(&VStack_48,vk,pVVar3,buffer);
  pAVar4 = Context::getDefaultAllocator(context);
  (*pAVar4->_vptr_Allocator[3])(__return_storage_ptr__,pAVar4,&VStack_48,(ulong)memReqs.m_flags);
  pVVar3 = Context::getDevice(context);
  pAVar1 = (__return_storage_ptr__->
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr;
  iVar2 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,pVVar3,buffer.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  return (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
         CONCAT44(extraout_var,iVar2);
}

Assistant:

MovePtr<vk::Allocation> allocateAndBindMemory (Context& context, vk::VkBuffer buffer, vk::MemoryRequirement memReqs)
{
	const vk::DeviceInterface&		vkd		= context.getDeviceInterface();
	const vk::VkMemoryRequirements	bufReqs	= vk::getBufferMemoryRequirements(vkd, context.getDevice(), buffer);
	MovePtr<vk::Allocation>			memory	= context.getDefaultAllocator().allocate(bufReqs, memReqs);

	vkd.bindBufferMemory(context.getDevice(), buffer, memory->getMemory(), memory->getOffset());

	return memory;
}